

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
SubcommandProgram_MultipleArgs_Test::~SubcommandProgram_MultipleArgs_Test
          (SubcommandProgram_MultipleArgs_Test *this)

{
  SubcommandProgram_MultipleArgs_Test *this_local;
  
  ~SubcommandProgram_MultipleArgs_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(SubcommandProgram, MultipleArgs) {
    args = {"start", "stop"};

    run();

    EXPECT_EQ((size_t)2, app.get_subcommands().size());
}